

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

float_t __thiscall djb::tab_r::qf2(tab_r *this,float_t u,float_t qf1,float_t zi)

{
  vec2 vVar1;
  uint uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  vec2 local_50;
  undefined1 local_48 [16];
  float_t local_38;
  float local_28;
  float_t fStack_24;
  float_t fStack_20;
  float_t fStack_1c;
  
  fVar5 = 0.0;
  if (0.0 <= u) {
    fVar5 = u;
  }
  local_48._0_4_ = 1.0;
  fVar4 = 1.0;
  if (fVar5 <= 1.0) {
    fVar4 = fVar5;
  }
  if ((fVar4 < 1.0) && ((1.0 < fVar5 || (local_48._0_4_ = 0.0, 1e-05 < ABS(u) && 0.0 <= u)))) {
    local_48._0_4_ = 0.0;
    uVar2 = 0;
    local_38 = u;
    do {
      local_48 = ZEXT416((uint)((float)(int)((uint)(0.0 < fVar4) - (uint)(fVar4 < 0.0)) /
                                (float)(2 << ((byte)uVar2 & 0x1f)) + (float)local_48._0_4_));
      local_50.y = 1.0;
      local_50.x = qf1;
      vVar1 = cdfv(this,&local_50,zi);
      local_28 = vVar1.y;
      local_50.y = (float_t)local_48._0_4_;
      local_50.x = qf1;
      fStack_24 = local_28;
      fStack_20 = local_28;
      fStack_1c = local_28;
      vVar1 = cdfv(this,&local_50,zi);
      fVar4 = local_38 - vVar1.y / local_28;
      if (ABS(fVar4) <= 1e-05) {
        return (float_t)local_48._0_4_;
      }
      bVar3 = uVar2 < 0x1d;
      uVar2 = uVar2 + 1;
    } while (bVar3);
  }
  return (float_t)local_48._0_4_;
}

Assistant:

float_t tab_r::qf2(float_t u, float_t qf1, float_t zi) const
{
	const float_t epsilon = 1e-5;
	float_t u2 = 0, delta = sat(u);
	int32_t level = 0;

	if (delta >= 1) return 1;

	while (fabs(delta) > epsilon && level < 30) {
		u2+= (float_t)sgn(delta) / (2 << level);
		delta = u - cdf2(u2, qf1, zi);
		++level;
	}

	return u2;
}